

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDefinition.cpp
# Opt level: O0

void __thiscall
Rml::PropertyDefinition::PropertyDefinition
          (PropertyDefinition *this,PropertyId id,String *_default_value,bool _inherited,
          bool _forces_layout)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_22;
  byte local_21;
  bool _forces_layout_local;
  String *pSStack_20;
  bool _inherited_local;
  String *_default_value_local;
  PropertyDefinition *pPStack_10;
  PropertyId id_local;
  PropertyDefinition *this_local;
  
  local_22 = _forces_layout;
  local_21 = _inherited;
  pSStack_20 = _default_value;
  _default_value_local._7_1_ = id;
  pPStack_10 = this;
  NonCopyMoveable::NonCopyMoveable((NonCopyMoveable *)this);
  this->id = _default_value_local._7_1_;
  ::std::__cxx11::string::string((string *)&local_48,(string *)pSStack_20);
  Property::Property<std::__cxx11::string>(&this->default_value,&local_48,UNKNOWN,-1);
  ::std::__cxx11::string::~string((string *)&local_48);
  ::std::
  vector<Rml::PropertyDefinition::ParserState,_std::allocator<Rml::PropertyDefinition::ParserState>_>
  ::vector(&this->parsers);
  this->relative_target = None;
  this->inherited = (bool)(local_21 & 1);
  this->forces_layout = (bool)(local_22 & 1);
  (this->default_value).definition = this;
  return;
}

Assistant:

PropertyDefinition::PropertyDefinition(PropertyId id, const String& _default_value, bool _inherited, bool _forces_layout) :
	id(id), default_value(_default_value, Unit::UNKNOWN), relative_target(RelativeTarget::None)
{
	inherited = _inherited;
	forces_layout = _forces_layout;
	default_value.definition = this;
}